

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vk_mem_alloc.h
# Opt level: O0

void __thiscall
VmaDedicatedAllocationList::BuildStatsString(VmaDedicatedAllocationList *this,VmaJsonWriter *json)

{
  ItemType *this_00;
  VmaRWMutex *in_RDI;
  VmaAllocation alloc;
  VmaMutexLockRead lock;
  ItemType *in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  VmaJsonWriter *in_stack_ffffffffffffffd0;
  ItemType *this_01;
  
  VmaMutexLockRead::VmaMutexLockRead
            ((VmaMutexLockRead *)in_stack_ffffffffffffffd0,in_RDI,
             SUB81((ulong)in_stack_ffffffffffffffc0 >> 0x38,0));
  VmaJsonWriter::BeginArray(in_stack_ffffffffffffffd0,SUB81((ulong)in_RDI >> 0x38,0));
  this_00 = VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits>::Front
                      ((VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits> *)
                       ((long)&in_RDI[1].m_Mutex._M_impl._M_rwlock + 8));
  this_01 = this_00;
  while (this_01 != (ItemType *)0x0) {
    VmaJsonWriter::BeginObject((VmaJsonWriter *)this_01,SUB81((ulong)in_RDI >> 0x38,0));
    VmaAllocation_T::PrintParameters(this_00,(VmaJsonWriter *)in_stack_ffffffffffffffb8);
    VmaJsonWriter::EndObject((VmaJsonWriter *)this_00);
    in_stack_ffffffffffffffb8 =
         VmaIntrusiveLinkedList<VmaDedicatedAllocationListItemTraits>::GetNext((ItemType *)0x2eb63e)
    ;
    this_01 = in_stack_ffffffffffffffb8;
  }
  VmaJsonWriter::EndArray((VmaJsonWriter *)this_00);
  VmaMutexLockRead::~VmaMutexLockRead((VmaMutexLockRead *)this_00);
  return;
}

Assistant:

void VmaDedicatedAllocationList::BuildStatsString(VmaJsonWriter& json)
{
    VmaMutexLockRead lock(m_Mutex, m_UseMutex);
    json.BeginArray();
    for (VmaAllocation alloc = m_AllocationList.Front();
        alloc != VMA_NULL; alloc = m_AllocationList.GetNext(alloc))
    {
        json.BeginObject(true);
        alloc->PrintParameters(json);
        json.EndObject();
    }
    json.EndArray();
}